

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::cpp_function<void,Job,std::__cxx11::string_const&>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  type local_20;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  local_20.f = f;
  initialize<pybind11::cpp_function::initialize<void,Job,std::__cxx11::string_const&>(void(Job::*)(std::__cxx11::string_const&))::_lambda(Job*,std::__cxx11::string_const&)_1_,void,Job*,std::__cxx11::string_const&>
            (this,&local_20,
             (_func_void_Job_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x0);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*) (Class *, Arg...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }